

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsUtils.cpp
# Opt level: O2

bool logValueDistribution
               (HighsLogOptions *log_options,HighsValueDistribution *value_distribution,HighsInt mu)

{
  uint uVar1;
  pointer pdVar2;
  bool bVar3;
  bool bVar4;
  HighsInt i;
  ulong uVar5;
  HighsInt i_1;
  uint uVar6;
  uint uVar7;
  ulong uVar8;
  double dVar9;
  double dVar10;
  string value_name;
  
  if ((value_distribution->sum_count_ < 1) ||
     (uVar8 = (ulong)value_distribution->num_count_, (long)uVar8 < 0)) {
    bVar4 = false;
  }
  else {
    bVar4 = std::operator!=(&value_distribution->distribution_name_,"");
    if (bVar4) {
      highsLogDev(log_options,kInfo,"\n%s\n");
    }
    std::__cxx11::string::string((string *)&value_name,(string *)&value_distribution->value_name_);
    uVar6 = value_distribution->num_one_ + value_distribution->num_zero_;
    dVar10 = value_distribution->min_value_;
    for (uVar5 = 0; uVar5 <= uVar8; uVar5 = uVar5 + 1) {
      uVar6 = uVar6 + (value_distribution->count_).super__Vector_base<int,_std::allocator<int>_>.
                      _M_impl.super__Vector_impl_data._M_start[uVar5];
    }
    bVar4 = uVar6 != 0;
    if (bVar4) {
      highsLogDev(log_options,kInfo,"Min value = %g\n");
      highsLogDev(log_options,kInfo,"     Minimum %svalue is %10.4g",dVar10,
                  value_name._M_dataplus._M_p);
      dVar9 = (double)mu;
      if (mu < 1) {
        highsLogDev(log_options,kInfo,"\n");
      }
      else {
        highsLogDev(log_options,kInfo,"  corresponding to  %10d / %10d\n",
                    (ulong)(uint)(int)(dVar10 * dVar9),(ulong)(uint)mu);
      }
      highsLogDev(log_options,kInfo,"     Maximum %svalue is %10.4g",value_distribution->max_value_,
                  value_name._M_dataplus._M_p);
      if (mu < 1) {
        highsLogDev(log_options,kInfo,"\n");
      }
      else {
        highsLogDev(log_options,kInfo,"  corresponding to  %10d / %10d\n",
                    (ulong)(uint)(int)(value_distribution->max_value_ * dVar9),(ulong)(uint)mu);
      }
      uVar7 = value_distribution->num_zero_;
      dVar10 = (double)(int)uVar6;
      if (uVar7 != 0) {
        highsLogDev(log_options,kInfo,"%12d %svalues (%3d%%) are %10.4g\n",0,(ulong)uVar7,
                    value_name._M_dataplus._M_p,
                    (ulong)(uint)(int)(((double)(int)uVar7 * 100.0) / dVar10));
      }
      uVar1 = *(value_distribution->count_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start;
      if (uVar1 != 0) {
        highsLogDev(log_options,kInfo,"%12d %svalues (%3d%%) in (%10.4g, %10.4g)",0,
                    *(value_distribution->limit_).
                     super__Vector_base<double,_std::allocator<double>_>._M_impl.
                     super__Vector_impl_data._M_start,(ulong)uVar1,value_name._M_dataplus._M_p,
                    (ulong)(uint)(int)(((double)(int)uVar1 * 100.0) / dVar10));
        uVar7 = uVar1 + uVar7;
        if (mu < 1) {
          highsLogDev(log_options,kInfo,"\n");
        }
        else {
          highsLogDev(log_options,kInfo," corresponding to (%10d, %10d)\n",0,
                      (ulong)(uint)(int)(*(value_distribution->limit_).
                                          super__Vector_base<double,_std::allocator<double>_>.
                                          _M_impl.super__Vector_impl_data._M_start * dVar9));
        }
      }
      bVar3 = true;
      for (uVar5 = 1; uVar5 < uVar8; uVar5 = uVar5 + 1) {
        if ((bVar3) &&
           (1.0 <= (value_distribution->limit_).super__Vector_base<double,_std::allocator<double>_>.
                   _M_impl.super__Vector_impl_data._M_start[uVar5 - 1])) {
          uVar1 = value_distribution->num_one_;
          if (uVar1 == 0) {
            bVar3 = false;
          }
          else {
            highsLogDev(log_options,kInfo,"%12d %svalues (%3d%%) are             %10.4g",
                        0x3ff0000000000000,(ulong)uVar1,value_name._M_dataplus._M_p,
                        (ulong)(uint)(int)(((double)(int)uVar1 * 100.0) / dVar10));
            uVar7 = uVar1 + uVar7;
            bVar3 = false;
            if (mu < 1) {
              highsLogDev(log_options,kInfo,"\n");
            }
            else {
              highsLogDev(log_options,kInfo," corresponding to %10d\n");
            }
          }
        }
        uVar1 = (value_distribution->count_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_start[uVar5];
        if (uVar1 != 0) {
          pdVar2 = (value_distribution->limit_).super__Vector_base<double,_std::allocator<double>_>.
                   _M_impl.super__Vector_impl_data._M_start;
          highsLogDev(log_options,kInfo,"%12d %svalues (%3d%%) in [%10.4g, %10.4g)",
                      pdVar2[uVar5 - 1],pdVar2[uVar5],(ulong)uVar1,value_name._M_dataplus._M_p,
                      (ulong)(uint)(int)(((double)(int)uVar1 * 100.0) / dVar10));
          uVar7 = uVar1 + uVar7;
          if (mu < 1) {
            highsLogDev(log_options,kInfo,"\n");
          }
          else {
            pdVar2 = (value_distribution->limit_).
                     super__Vector_base<double,_std::allocator<double>_>._M_impl.
                     super__Vector_impl_data._M_start;
            highsLogDev(log_options,kInfo," corresponding to [%10d, %10d)\n",
                        (ulong)(uint)(int)(pdVar2[uVar5 - 1] * dVar9),
                        (ulong)(uint)(int)(pdVar2[uVar5] * dVar9));
          }
        }
      }
      if ((bVar3) &&
         (1.0 <= (value_distribution->limit_).super__Vector_base<double,_std::allocator<double>_>.
                 _M_impl.super__Vector_impl_data._M_start[uVar8 - 1])) {
        uVar1 = value_distribution->num_one_;
        if (uVar1 == 0) {
          bVar3 = false;
        }
        else {
          highsLogDev(log_options,kInfo,"%12d %svalues (%3d%%) are             %10.4g",
                      0x3ff0000000000000,(ulong)uVar1,value_name._M_dataplus._M_p,
                      (ulong)(uint)(int)(((double)(int)uVar1 * 100.0) / dVar10));
          uVar7 = uVar1 + uVar7;
          bVar3 = false;
          if (mu < 1) {
            highsLogDev(log_options,kInfo,"\n");
          }
          else {
            highsLogDev(log_options,kInfo,"  corresponding to  %10d\n");
          }
        }
      }
      uVar1 = (value_distribution->count_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_start[uVar8];
      if (uVar1 != 0) {
        highsLogDev(log_options,kInfo,"%12d %svalues (%3d%%) in [%10.4g,        inf)",
                    (value_distribution->limit_).super__Vector_base<double,_std::allocator<double>_>
                    ._M_impl.super__Vector_impl_data._M_start[uVar8 - 1],(ulong)uVar1,
                    value_name._M_dataplus._M_p,
                    (ulong)(uint)(int)(((double)(int)uVar1 * 100.0) / dVar10));
        uVar7 = uVar1 + uVar7;
        if (mu < 1) {
          highsLogDev(log_options,kInfo,"\n");
        }
        else {
          highsLogDev(log_options,kInfo," corresponding to [%10d,        inf)\n",
                      (ulong)(uint)(int)(dVar9 * (value_distribution->limit_).
                                                 super__Vector_base<double,_std::allocator<double>_>
                                                 ._M_impl.super__Vector_impl_data._M_start
                                                 [uVar8 - 1]));
        }
      }
      if ((bVar3) && (uVar1 = value_distribution->num_one_, uVar1 != 0)) {
        highsLogDev(log_options,kInfo,"%12d %svalues (%3d%%) are             %10.4g",
                    0x3ff0000000000000,(ulong)uVar1,value_name._M_dataplus._M_p,
                    (ulong)(uint)(int)(((double)(int)uVar1 * 100.0) / dVar10));
        uVar7 = uVar1 + uVar7;
        if (mu < 1) {
          highsLogDev(log_options,kInfo,"\n");
        }
        else {
          highsLogDev(log_options,kInfo,"  corresponding to  %10d\n");
        }
      }
      highsLogDev(log_options,kInfo,"%12d %svalues\n",(ulong)uVar6,value_name._M_dataplus._M_p);
      if (uVar7 != uVar6) {
        highsLogDev(log_options,kInfo,"ERROR: %d = sum_report_count != sum_count = %d\n",
                    (ulong)uVar7,(ulong)uVar6);
      }
    }
    std::__cxx11::string::~string((string *)&value_name);
  }
  return bVar4;
}

Assistant:

bool logValueDistribution(const HighsLogOptions& log_options,
                          const HighsValueDistribution& value_distribution,
                          const HighsInt mu) {
  if (value_distribution.sum_count_ <= 0) return false;
  const HighsInt num_count = value_distribution.num_count_;
  if (num_count < 0) return false;
  if (value_distribution.distribution_name_ != "")
    highsLogDev(log_options, HighsLogType::kInfo, "\n%s\n",
                value_distribution.distribution_name_.c_str());
  std::string value_name = value_distribution.value_name_;
  bool not_reported_ones = true;
  HighsInt sum_count =
      value_distribution.num_zero_ + value_distribution.num_one_;
  const double min_value = value_distribution.min_value_;
  for (HighsInt i = 0; i < num_count + 1; i++)
    sum_count += value_distribution.count_[i];
  if (!sum_count) return false;
  highsLogDev(log_options, HighsLogType::kInfo, "Min value = %g\n", min_value);
  highsLogDev(log_options, HighsLogType::kInfo,
              "     Minimum %svalue is %10.4g", value_name.c_str(), min_value);
  if (mu > 0) {
    highsLogDev(log_options, HighsLogType::kInfo,
                "  corresponding to  %10" HIGHSINT_FORMAT
                " / %10" HIGHSINT_FORMAT "\n",
                (HighsInt)(min_value * mu), mu);
  } else {
    highsLogDev(log_options, HighsLogType::kInfo, "\n");
  }
  highsLogDev(log_options, HighsLogType::kInfo,
              "     Maximum %svalue is %10.4g", value_name.c_str(),
              value_distribution.max_value_);
  if (mu > 0) {
    highsLogDev(log_options, HighsLogType::kInfo,
                "  corresponding to  %10" HIGHSINT_FORMAT
                " / %10" HIGHSINT_FORMAT "\n",
                (HighsInt)(value_distribution.max_value_ * mu), mu);
  } else {
    highsLogDev(log_options, HighsLogType::kInfo, "\n");
  }
  HighsInt sum_report_count = 0;
  double percentage;
  HighsInt int_percentage;
  HighsInt count = value_distribution.num_zero_;
  if (count) {
    percentage = doublePercentage(count, sum_count);
    int_percentage = percentage;
    highsLogDev(log_options, HighsLogType::kInfo,
                "%12" HIGHSINT_FORMAT " %svalues (%3" HIGHSINT_FORMAT
                "%%) are %10.4g\n",
                count, value_name.c_str(), int_percentage, 0.0);
    sum_report_count += count;
  }
  count = value_distribution.count_[0];
  if (count) {
    percentage = doublePercentage(count, sum_count);
    int_percentage = percentage;
    highsLogDev(log_options, HighsLogType::kInfo,
                "%12" HIGHSINT_FORMAT " %svalues (%3" HIGHSINT_FORMAT
                "%%) in (%10.4g, %10.4g)",
                count, value_name.c_str(), int_percentage, 0.0,
                value_distribution.limit_[0]);
    sum_report_count += count;
    if (mu > 0) {
      highsLogDev(log_options, HighsLogType::kInfo,
                  " corresponding to (%10" HIGHSINT_FORMAT
                  ", %10" HIGHSINT_FORMAT ")\n",
                  0, (HighsInt)(value_distribution.limit_[0] * mu));
    } else {
      highsLogDev(log_options, HighsLogType::kInfo, "\n");
    }
  }
  for (HighsInt i = 1; i < num_count; i++) {
    if (not_reported_ones && value_distribution.limit_[i - 1] >= 1.0) {
      count = value_distribution.num_one_;
      if (count) {
        percentage = doublePercentage(count, sum_count);
        int_percentage = percentage;
        highsLogDev(log_options, HighsLogType::kInfo,
                    "%12" HIGHSINT_FORMAT " %svalues (%3" HIGHSINT_FORMAT
                    "%%) are             %10.4g",
                    count, value_name.c_str(), int_percentage, 1.0);
        sum_report_count += count;
        if (mu > 0) {
          highsLogDev(log_options, HighsLogType::kInfo,
                      " corresponding to %10" HIGHSINT_FORMAT "\n", mu);
        } else {
          highsLogDev(log_options, HighsLogType::kInfo, "\n");
        }
      }
      not_reported_ones = false;
    }
    count = value_distribution.count_[i];
    if (count) {
      percentage = doublePercentage(count, sum_count);
      int_percentage = percentage;
      highsLogDev(log_options, HighsLogType::kInfo,
                  "%12" HIGHSINT_FORMAT " %svalues (%3" HIGHSINT_FORMAT
                  "%%) in [%10.4g, %10.4g)",
                  count, value_name.c_str(), int_percentage,
                  value_distribution.limit_[i - 1],
                  value_distribution.limit_[i]);
      sum_report_count += count;
      if (mu > 0) {
        highsLogDev(log_options, HighsLogType::kInfo,
                    " corresponding to [%10" HIGHSINT_FORMAT
                    ", %10" HIGHSINT_FORMAT ")\n",
                    (HighsInt)(value_distribution.limit_[i - 1] * mu),
                    (HighsInt)(value_distribution.limit_[i] * mu));
      } else {
        highsLogDev(log_options, HighsLogType::kInfo, "\n");
      }
    }
  }
  if (not_reported_ones && value_distribution.limit_[num_count - 1] >= 1.0) {
    count = value_distribution.num_one_;
    if (count) {
      percentage = doublePercentage(count, sum_count);
      int_percentage = percentage;
      highsLogDev(log_options, HighsLogType::kInfo,
                  "%12" HIGHSINT_FORMAT " %svalues (%3" HIGHSINT_FORMAT
                  "%%) are             %10.4g",
                  count, value_name.c_str(), int_percentage, 1.0);
      sum_report_count += count;
      if (mu > 0) {
        highsLogDev(log_options, HighsLogType::kInfo,
                    "  corresponding to  %10" HIGHSINT_FORMAT "\n", mu);
      } else {
        highsLogDev(log_options, HighsLogType::kInfo, "\n");
      }
    }
    not_reported_ones = false;
  }
  count = value_distribution.count_[num_count];
  if (count) {
    percentage = doublePercentage(count, sum_count);
    int_percentage = percentage;
    highsLogDev(log_options, HighsLogType::kInfo,
                "%12" HIGHSINT_FORMAT " %svalues (%3" HIGHSINT_FORMAT
                "%%) in [%10.4g,        inf)",
                count, value_name.c_str(), int_percentage,
                value_distribution.limit_[num_count - 1]);
    sum_report_count += count;
    if (mu > 0) {
      highsLogDev(log_options, HighsLogType::kInfo,
                  " corresponding to [%10" HIGHSINT_FORMAT ",        inf)\n",
                  (HighsInt)(value_distribution.limit_[num_count - 1] * mu));
    } else {
      highsLogDev(log_options, HighsLogType::kInfo, "\n");
    }
  }
  if (not_reported_ones) {
    count = value_distribution.num_one_;
    if (count) {
      percentage = doublePercentage(count, sum_count);
      int_percentage = percentage;
      highsLogDev(log_options, HighsLogType::kInfo,
                  "%12" HIGHSINT_FORMAT " %svalues (%3" HIGHSINT_FORMAT
                  "%%) are             %10.4g",
                  count, value_name.c_str(), int_percentage, 1.0);
      sum_report_count += count;
      if (mu > 0) {
        highsLogDev(log_options, HighsLogType::kInfo,
                    "  corresponding to  %10" HIGHSINT_FORMAT "\n", mu);
      } else {
        highsLogDev(log_options, HighsLogType::kInfo, "\n");
      }
    }
  }
  highsLogDev(log_options, HighsLogType::kInfo,
              "%12" HIGHSINT_FORMAT " %svalues\n", sum_count,
              value_name.c_str());
  if (sum_report_count != sum_count)
    highsLogDev(log_options, HighsLogType::kInfo,
                "ERROR: %" HIGHSINT_FORMAT
                " = sum_report_count != sum_count = %" HIGHSINT_FORMAT "\n",
                sum_report_count, sum_count);
  return true;
}